

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HttpClient.cpp
# Opt level: O2

void __thiscall Liby::http::HttpClient::handleConnection(HttpClient *this,ConnPtr *conn)

{
  _Any_data local_50;
  code *local_40;
  code *local_38;
  _Any_data local_30;
  code *local_20;
  code *local_18;
  
  std::__shared_ptr<Liby::Connection,_(__gnu_cxx::_Lock_policy)2>::operator=
            (&(this->http_conn_).super___shared_ptr<Liby::Connection,_(__gnu_cxx::_Lock_policy)2>,
             &conn->super___shared_ptr<Liby::Connection,_(__gnu_cxx::_Lock_policy)2>);
  local_30._8_8_ = 0;
  local_18 = std::
             _Function_handler<void_(Liby::Connection_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/ccsexyz[P]liby-cpp/src/http/HttpClient.cpp:29:24)>
             ::_M_invoke;
  local_20 = std::
             _Function_handler<void_(Liby::Connection_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/ccsexyz[P]liby-cpp/src/http/HttpClient.cpp:29:24)>
             ::_M_manager;
  local_30._M_unused._M_object = this;
  std::function<void_(Liby::Connection_&)>::operator=
            (&((this->http_conn_).super___shared_ptr<Liby::Connection,_(__gnu_cxx::_Lock_policy)2>.
              _M_ptr)->readEventCallback_,(function<void_(Liby::Connection_&)> *)&local_30);
  std::_Function_base::~_Function_base((_Function_base *)&local_30);
  local_50._8_8_ = 0;
  local_38 = std::
             _Function_handler<void_(Liby::Connection_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/ccsexyz[P]liby-cpp/src/http/HttpClient.cpp:30:24)>
             ::_M_invoke;
  local_40 = std::
             _Function_handler<void_(Liby::Connection_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/ccsexyz[P]liby-cpp/src/http/HttpClient.cpp:30:24)>
             ::_M_manager;
  local_50._M_unused._M_object = this;
  std::function<void_(Liby::Connection_&)>::operator=
            (&((this->http_conn_).super___shared_ptr<Liby::Connection,_(__gnu_cxx::_Lock_policy)2>.
              _M_ptr)->erroEventCallback_,(function<void_(Liby::Connection_&)> *)&local_50);
  std::_Function_base::~_Function_base((_Function_base *)&local_50);
  if ((this->requestLists_).
      super__List_base<std::pair<Liby::http::Request,_std::function<void_(Liby::http::Reply_&)>_>,_std::allocator<std::pair<Liby::http::Request,_std::function<void_(Liby::http::Reply_&)>_>_>_>
      ._M_impl._M_node.super__List_node_base._M_next != (_List_node_base *)&this->requestLists_) {
    sendRequest(this);
  }
  return;
}

Assistant:

void HttpClient::handleConnection(ConnPtr conn) {
    http_conn_ = conn;
    http_conn_->onRead([this](Connection &c) { handleReadEvent(c); });
    http_conn_->onErro([this](Connection &c) { handleErroEvent(c); });
    if (!requestLists_.empty())
        sendRequest();
}